

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman.c
# Opt level: O1

uint32_t calculate_value(char *raw,size_t *pos,size_t max)

{
  size_t sVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint32_t uVar6;
  
  iVar5 = 0;
  while (sVar3 = numeral_no(raw[*pos]), sVar3 != 0) {
    uVar6 = ROMAN_VALUE[sVar3];
    while( true ) {
      sVar1 = *pos;
      if (sVar1 == 0) goto LAB_001012d3;
      sVar4 = numeral_no(raw[sVar1 - 1]);
      if (sVar3 <= sVar4) break;
      *pos = sVar1 - 1;
      uVar2 = calculate_value(raw,pos,sVar3);
      uVar6 = uVar6 - uVar2;
    }
    if ((sVar1 == 0) || (sVar3 = numeral_no(raw[sVar1 - 1]), max <= sVar3)) goto LAB_001012d3;
    *pos = sVar1 - 1;
    iVar5 = iVar5 + uVar6;
  }
  uVar6 = 0;
LAB_001012d3:
  return iVar5 + uVar6;
}

Assistant:

uint32_t calculate_value(const char* raw, size_t* pos, size_t max) {
  const size_t my_no = numeral_no(raw[*pos]);
  if (my_no == 0) return 0; // ERROR

  uint32_t value = ROMAN_VALUE[my_no];

  while (*pos > 0 && numeral_no(raw[*pos - 1]) < my_no) {
    *pos -= 1;
    value -= calculate_value(raw, pos, my_no);
  }

  if (*pos > 0 && numeral_no(raw[*pos - 1]) < max) {
    *pos -= 1;
    return value + calculate_value(raw, pos, max);
  } else {
    return value;
  }
}